

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int str_char(lua_State *L)

{
  int iVar1;
  lua_Integer lVar2;
  char *pcVar3;
  lua_State *in_RDI;
  int c;
  luaL_Buffer b;
  int i;
  int n;
  int in_stack_ffffffffffffdfcc;
  undefined2 in_stack_ffffffffffffdfd0;
  undefined1 in_stack_ffffffffffffdfd2;
  undefined1 in_stack_ffffffffffffdfd3;
  uint in_stack_ffffffffffffdfd4;
  int *local_2028;
  char *in_stack_ffffffffffffe038;
  int in_stack_ffffffffffffe044;
  lua_State *in_stack_ffffffffffffe048;
  int local_10;
  int local_c;
  lua_State *local_8;
  
  local_8 = in_RDI;
  local_c = lua_gettop(in_RDI);
  luaL_buffinit(local_8,(luaL_Buffer *)&local_2028);
  for (local_10 = 1; local_10 <= local_c; local_10 = local_10 + 1) {
    lVar2 = luaL_checkinteger((lua_State *)
                              CONCAT44(in_stack_ffffffffffffdfd4,
                                       CONCAT13(in_stack_ffffffffffffdfd3,
                                                CONCAT12(in_stack_ffffffffffffdfd2,
                                                         in_stack_ffffffffffffdfd0))),
                              in_stack_ffffffffffffdfcc);
    in_stack_ffffffffffffdfd4 = (uint)lVar2;
    in_stack_ffffffffffffdfd3 = true;
    if ((in_stack_ffffffffffffdfd4 & 0xff) != in_stack_ffffffffffffdfd4) {
      iVar1 = luaL_argerror(in_stack_ffffffffffffe048,in_stack_ffffffffffffe044,
                            in_stack_ffffffffffffe038);
      in_stack_ffffffffffffdfd3 = iVar1 != 0;
    }
    in_stack_ffffffffffffdfd2 = true;
    if (&local_10 <= local_2028) {
      pcVar3 = luaL_prepbuffer((luaL_Buffer *)0x11db92);
      in_stack_ffffffffffffdfd2 = pcVar3 != (char *)0x0;
    }
    *(char *)local_2028 = (char)in_stack_ffffffffffffdfd4;
    local_2028 = (int *)((long)local_2028 + 1);
  }
  luaL_pushresult((luaL_Buffer *)0x11dbda);
  return 1;
}

Assistant:

static int str_char(lua_State*L){
int n=lua_gettop(L);
int i;
luaL_Buffer b;
luaL_buffinit(L,&b);
for(i=1;i<=n;i++){
int c=luaL_checkint(L,i);
luaL_argcheck(L,uchar(c)==c,i,"invalid value");
luaL_addchar(&b,uchar(c));
}
luaL_pushresult(&b);
return 1;
}